

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::BasicWriter<char>::write(BasicWriter<char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> local_60;
  BasicWriter<char> *local_28;
  BasicWriter<char> *this_local;
  ArgList args_local;
  BasicCStringRef<char> format_local;
  
  args_local.field_1._4_4_ = in_register_00000034;
  args_local.field_1._0_4_ = __fd;
  local_28 = this;
  this_local = (BasicWriter<char> *)__buf;
  args_local.types_ = __n;
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::BasicFormatter
            (&local_60,(ArgList *)&this_local,this);
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
            (&local_60,(BasicCStringRef<char>)args_local.field_1);
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::~BasicFormatter(&local_60);
  return extraout_RAX;
}

Assistant:

void write(BasicCStringRef<Char> format, ArgList args)
    {
        BasicFormatter<Char>(args, *this).format(format);
    }